

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiTable * __thiscall ImPool<ImGuiTable>::Add(ImPool<ImGuiTable> *this)

{
  int iVar1;
  ImGuiID IVar2;
  ImGuiTable *pIVar3;
  
  iVar1 = this->FreeIdx;
  if (iVar1 == (this->Buf).Size) {
    ImVector<ImGuiTable>::resize(&this->Buf,iVar1 + 1);
    IVar2 = this->FreeIdx + 1;
    pIVar3 = (this->Buf).Data;
  }
  else {
    pIVar3 = (this->Buf).Data;
    IVar2 = pIVar3[iVar1].ID;
  }
  this->FreeIdx = IVar2;
  memset(pIVar3 + iVar1,0,0x208);
  pIVar3[iVar1].LastFrameActive = -1;
  this->AliveCount = this->AliveCount + 1;
  return (this->Buf).Data + iVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }